

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O2

void work_gga_exc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double *pdVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  double dVar37;
  double __x;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  undefined8 uVar41;
  double dVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double local_298;
  double local_288;
  double local_180;
  double local_148;
  double local_120;
  
  local_148 = 0.0;
  local_180 = 0.0;
  for (sVar10 = 0; np != sVar10; sVar10 = sVar10 + 1) {
    lVar8 = (long)(p->dim).rho * sVar10;
    dVar25 = rho[lVar8];
    if (p->nspin == 2) {
      dVar25 = dVar25 + rho[lVar8 + 1];
    }
    dVar1 = p->dens_threshold;
    if (dVar1 <= dVar25) {
      lVar9 = (long)(p->dim).sigma * sVar10;
      dVar25 = p->sigma_threshold * p->sigma_threshold;
      if (p->nspin == 2) {
        local_148 = rho[lVar8 + 1];
        if (rho[lVar8 + 1] <= dVar1) {
          local_148 = dVar1;
        }
        local_180 = sigma[lVar9 + 2];
        if (sigma[lVar9 + 2] <= dVar25) {
          local_180 = dVar25;
        }
      }
      dVar4 = rho[lVar8];
      if (rho[lVar8] <= dVar1) {
        dVar4 = dVar1;
      }
      dVar2 = sigma[lVar9];
      pdVar5 = (double *)p->params;
      dVar35 = dVar4 - local_148;
      __x = dVar4 + local_148;
      dVar26 = (1.0 / __x) * dVar35;
      dVar27 = dVar26 + 1.0;
      dVar3 = p->zeta_threshold;
      dVar13 = cbrt(0.3183098861837907);
      dVar14 = dVar13 * 2.519842099789747 * 1.2599210498948732;
      dVar15 = cbrt(dVar3);
      dVar28 = dVar3 * dVar15;
      local_298 = dVar28;
      if (dVar3 < 2.0) {
        local_298 = 2.5198420997897464;
      }
      if (dVar2 <= dVar25) {
        dVar2 = dVar25;
      }
      dVar16 = cbrt(__x);
      dVar17 = cbrt(1.0 / dVar27);
      dVar18 = cbrt(9.0);
      dVar36 = (1.0 / dVar16) * 1.2599210498948732;
      dVar15 = 1.0 / dVar15;
      dVar25 = (double)(~-(ulong)(2.0 <= dVar3) & 0x3fe965fea53d6e3c |
                       -(ulong)(2.0 <= dVar3) & (ulong)dVar15);
      dVar38 = p->cam_omega * 1.4422495703074083 * dVar18 * dVar18 * dVar13 * dVar13 * dVar36;
      dVar29 = (dVar17 * dVar25 * dVar38) / 18.0;
      dVar18 = 1.35;
      if (dVar29 <= 1.35) {
        dVar18 = dVar29;
      }
      dVar19 = erf((1.0 / dVar18) * 0.5);
      dVar20 = exp((-1.0 / (dVar18 * dVar18)) * 0.25);
      if (1.35 <= dVar29) {
        if (dVar29 <= 1.35) {
          dVar29 = 1.35;
        }
        auVar46._0_8_ = dVar29 * dVar29;
        dVar18 = auVar46._0_8_ * auVar46._0_8_;
        auVar46._8_8_ = dVar18;
        dVar29 = dVar18 * dVar18;
        auVar47 = divpd(_DAT_00f4add0,auVar46);
        auVar44 = divpd(auVar47,_DAT_00f570a0);
        auVar40._8_8_ = dVar29;
        auVar40._0_8_ = auVar46._0_8_ * dVar18;
        auVar40 = divpd(_DAT_00f4add0,auVar40);
        uVar41 = auVar40._8_8_;
        auVar34._8_8_ = 0x3ff0000000000000;
        auVar34._0_8_ = uVar41;
        auVar47._8_8_ = dVar29 * dVar29;
        auVar47._0_8_ = auVar46._0_8_ * dVar18;
        auVar47 = divpd(auVar34,auVar47);
        auVar48._8_8_ = uVar41;
        auVar48._0_8_ = uVar41;
        auVar34 = divpd(auVar48,auVar46);
        auVar40 = divpd(auVar40,_DAT_00f570b0);
        auVar34 = divpd(auVar34,_DAT_00f570c0);
        auVar47 = divpd(auVar47,_DAT_00f570d0);
        local_288 = ((((((auVar44._0_8_ - auVar44._8_8_) + auVar40._0_8_) - auVar40._8_8_) +
                      auVar34._0_8_) - auVar34._8_8_) + auVar47._0_8_) - auVar47._8_8_;
      }
      else {
        local_288 = dVar18 * -2.6666666666666665 *
                    (dVar19 * 1.7724538509055159 +
                    (dVar20 + -1.5 + (dVar20 + -1.0) * dVar18 * dVar18 * -2.0) * (dVar18 + dVar18))
                    + 1.0;
      }
      dVar18 = *pdVar5;
      dVar29 = pdVar5[1];
      dVar30 = dVar4 * dVar4;
      dVar21 = cbrt(dVar4);
      dVar56 = 1.0 / (dVar21 * dVar21);
      dVar54 = dVar56 / dVar30;
      dVar52 = dVar2 * dVar54;
      dVar19 = pdVar5[2];
      dVar20 = pdVar5[3];
      dVar37 = dVar2 * dVar2;
      dVar39 = dVar30 * dVar30;
      dVar57 = (1.0 / dVar21) / (dVar4 * dVar39);
      dVar58 = 1.0 / (dVar39 * dVar39);
      dVar21 = pdVar5[4];
      dVar56 = dVar56 / (dVar39 * dVar39 * dVar30);
      dVar30 = 0.0;
      if (dVar1 < dVar4 && dVar3 < dVar27) {
        dVar30 = dVar52 * 0.004 + 1.0;
        dVar39 = dVar30 * dVar30;
        dVar30 = dVar27 * 1.4422495703074083 * dVar14 * -0.046875 *
                 (dVar2 * dVar29 * 0.004 * dVar54 * (1.0 / dVar30) + dVar18 +
                  dVar37 * dVar19 * 1.6e-05 * (1.0 / dVar39) * dVar57 +
                  dVar2 * dVar37 * dVar20 * 6.4e-08 * (1.0 / (dVar30 * dVar39)) * dVar58 +
                 dVar37 * dVar37 * dVar21 * 2.56e-10 * (1.0 / (dVar39 * dVar39)) * dVar56) *
                 (1.0 / dVar17) * local_288 * dVar16 * local_298;
      }
      dVar26 = 1.0 - dVar26;
      dVar17 = p->zeta_threshold;
      bVar7 = p->dens_threshold < local_148;
      dVar39 = cbrt(1.0 / dVar26);
      dVar38 = (dVar38 * dVar25 * dVar39) / 18.0;
      dVar25 = 1.35;
      if (dVar38 <= 1.35) {
        dVar25 = dVar38;
      }
      dVar22 = erf((1.0 / dVar25) * 0.5);
      dVar23 = exp((-1.0 / (dVar25 * dVar25)) * 0.25);
      if (1.35 <= dVar38) {
        if (dVar38 <= 1.35) {
          dVar38 = 1.35;
        }
        auVar45._0_8_ = dVar38 * dVar38;
        dVar25 = auVar45._0_8_ * auVar45._0_8_;
        auVar45._8_8_ = dVar25;
        dVar38 = dVar25 * dVar25;
        auVar47 = divpd(_DAT_00f4add0,auVar45);
        auVar48 = divpd(auVar47,_DAT_00f570a0);
        auVar32._8_8_ = dVar38;
        auVar32._0_8_ = auVar45._0_8_ * dVar25;
        auVar40 = divpd(_DAT_00f4add0,auVar32);
        uVar41 = auVar40._8_8_;
        auVar24._8_8_ = 0x3ff0000000000000;
        auVar24._0_8_ = uVar41;
        auVar44._8_8_ = dVar38 * dVar38;
        auVar44._0_8_ = auVar45._0_8_ * dVar25;
        auVar47 = divpd(auVar24,auVar44);
        auVar33._8_8_ = uVar41;
        auVar33._0_8_ = uVar41;
        auVar34 = divpd(auVar33,auVar45);
        auVar40 = divpd(auVar40,_DAT_00f570b0);
        auVar34 = divpd(auVar34,_DAT_00f570c0);
        auVar47 = divpd(auVar47,_DAT_00f570d0);
        local_288 = ((((((auVar48._0_8_ - auVar48._8_8_) + auVar40._0_8_) - auVar40._8_8_) +
                      auVar34._0_8_) - auVar34._8_8_) + auVar47._0_8_) - auVar47._8_8_;
      }
      else {
        local_288 = dVar25 * -2.6666666666666665 *
                    (dVar22 * 1.7724538509055159 +
                    (dVar23 + -1.5 + (dVar23 + -1.0) * dVar25 * dVar25 * -2.0) * (dVar25 + dVar25))
                    + 1.0;
      }
      dVar22 = local_148 * local_148;
      dVar25 = cbrt(local_148);
      dVar51 = 1.0 / (dVar25 * dVar25);
      dVar50 = dVar51 / dVar22;
      dVar49 = local_180 * dVar50;
      dVar23 = local_180 * local_180;
      dVar38 = dVar22 * dVar22;
      dVar53 = (1.0 / dVar25) / (local_148 * dVar38);
      dVar55 = 1.0 / (dVar38 * dVar38);
      dVar51 = dVar51 / (dVar38 * dVar38 * dVar22);
      dVar25 = 0.0;
      if (dVar17 < dVar26 && bVar7) {
        dVar25 = dVar49 * 0.004 + 1.0;
        dVar38 = dVar25 * dVar25;
        dVar25 = dVar26 * 1.4422495703074083 * dVar14 * -0.046875 *
                 dVar16 * local_298 *
                 (dVar29 * local_180 * 0.004 * dVar50 * (1.0 / dVar25) + dVar18 +
                  dVar19 * dVar23 * 1.6e-05 * (1.0 / dVar38) * dVar53 +
                  dVar20 * local_180 * dVar23 * 6.4e-08 * (1.0 / (dVar25 * dVar38)) * dVar55 +
                 dVar21 * dVar23 * dVar23 * 2.56e-10 * (1.0 / (dVar38 * dVar38)) * dVar51) *
                 (1.0 / dVar39) * local_288;
      }
      dVar14 = dVar27;
      if (dVar27 <= dVar3) {
        dVar14 = p->zeta_threshold;
      }
      dVar29 = dVar13 * 1.4422495703074083 * 2.519842099789747;
      dVar38 = cbrt(dVar27);
      uVar11 = -(ulong)(dVar27 <= dVar3);
      dVar21 = (double)(uVar11 & (ulong)dVar15 | ~uVar11 & (ulong)(1.0 / dVar38));
      dVar36 = dVar36 * dVar29;
      dVar20 = dVar36 * dVar21;
      dVar19 = SQRT(dVar20);
      dVar18 = dVar19;
      if (dVar20 < 0.0) {
        dVar18 = sqrt(dVar20);
      }
      if (dVar20 < 0.0) {
        dVar19 = sqrt(dVar20);
      }
      dVar19 = dVar19 * dVar20;
      dVar22 = dVar13 * dVar13 * 2.080083823051904 * 1.5874010519681996;
      dVar42 = 1.0 / (dVar16 * dVar16);
      dVar43 = dVar42 * 1.5874010519681996 * dVar22;
      dVar13 = dVar21 * dVar21 * dVar43;
      dVar21 = log(16.081824322151103 /
                   (dVar13 * 0.123235 + dVar19 * 0.204775 + dVar18 * 3.79785 + dVar20 * 0.8969) +
                   1.0);
      dVar21 = (dVar20 * 0.053425 + 1.0) * 0.062182 * dVar21;
      local_120 = 0.0;
      dVar31 = (local_298 + (double)(-(ulong)(0.0 <= p->zeta_threshold) & (ulong)dVar28) + -2.0) *
               1.9236610509315362;
      dVar39 = log(32.1646831778707 /
                   (dVar13 * 0.1562925 + dVar19 * 0.420775 + dVar18 * 7.05945 + dVar20 * 1.549425) +
                   1.0);
      dVar13 = log(29.608574643216677 /
                   (dVar13 * 0.1241775 + dVar19 * 0.1100325 + dVar18 * 5.1785 + dVar20 * 0.905775) +
                   1.0);
      dVar13 = dVar13 * (dVar20 * 0.0278125 + 1.0);
      if (dVar1 < dVar4 && dVar3 < dVar27) {
        local_120 = dVar14 * (dVar13 * dVar31 * 0.019751789702565206 +
                             ((dVar13 * -0.019751789702565206 +
                              (dVar20 * 0.05137 + 1.0) * -0.03109 * dVar39 + dVar21) * dVar31 -
                             dVar21)) * 0.5;
      }
      dVar1 = pdVar5[5];
      dVar4 = pdVar5[6];
      dVar3 = pdVar5[7];
      dVar13 = pdVar5[8];
      dVar14 = pdVar5[9];
      dVar18 = dVar26;
      if (dVar26 <= dVar17) {
        dVar18 = p->zeta_threshold;
      }
      dVar19 = cbrt(dVar26);
      uVar12 = -(ulong)(dVar26 <= dVar17);
      dVar21 = (double)((ulong)dVar15 & uVar12 | ~uVar12 & (ulong)(1.0 / dVar19));
      dVar36 = dVar36 * dVar21;
      dVar20 = SQRT(dVar36);
      dVar15 = dVar20;
      if (dVar36 < 0.0) {
        dVar15 = sqrt(dVar36);
      }
      if (dVar36 < 0.0) {
        dVar20 = sqrt(dVar36);
      }
      dVar20 = dVar20 * dVar36;
      dVar43 = dVar43 * dVar21 * dVar21;
      dVar21 = log(16.081824322151103 /
                   (dVar43 * 0.123235 + dVar20 * 0.204775 + dVar15 * 3.79785 + dVar36 * 0.8969) +
                   1.0);
      dVar21 = (dVar36 * 0.053425 + 1.0) * 0.062182 * dVar21;
      dVar39 = log(32.1646831778707 /
                   (dVar43 * 0.1562925 + dVar20 * 0.420775 + dVar15 * 7.05945 + dVar36 * 1.549425) +
                   1.0);
      dVar20 = log(29.608574643216677 /
                   (dVar43 * 0.1241775 + dVar20 * 0.1100325 + dVar15 * 5.1785 + dVar36 * 0.905775) +
                   1.0);
      dVar20 = dVar20 * (dVar36 * 0.0278125 + 1.0);
      dVar15 = 0.0;
      if (dVar17 < dVar26 && bVar7) {
        dVar15 = dVar18 * ((dVar31 * (dVar20 * -0.019751789702565206 +
                                     (dVar36 * 0.05137 + 1.0) * -0.03109 * dVar39 + dVar21) - dVar21
                           ) + dVar31 * 0.019751789702565206 * dVar20) * 0.5;
      }
      dVar29 = dVar29 * (1.0 / dVar16);
      dVar16 = SQRT(dVar29);
      dVar18 = dVar16;
      if (dVar29 < 0.0) {
        dVar18 = sqrt(dVar29);
      }
      if (dVar29 < 0.0) {
        dVar16 = sqrt(dVar29);
      }
      dVar16 = dVar16 * dVar29;
      dVar22 = dVar22 * dVar42;
      dVar17 = log(16.081824322151103 /
                   (dVar22 * 0.123235 + dVar16 * 0.204775 + dVar18 * 3.79785 + dVar29 * 0.8969) +
                   1.0);
      dVar36 = ((double)(uVar12 & (ulong)dVar28 | ~uVar12 & (ulong)(dVar26 * dVar19)) +
                (double)(uVar11 & (ulong)dVar28 | ~uVar11 & (ulong)(dVar27 * dVar38)) + -2.0) *
               1.9236610509315362;
      dVar26 = log(32.1646831778707 /
                   (dVar22 * 0.1562925 + dVar16 * 0.420775 + dVar18 * 7.05945 + dVar29 * 1.549425) +
                   1.0);
      dVar27 = log(29.608574643216677 /
                   (dVar22 * 0.1241775 + dVar16 * 0.1100325 + dVar18 * 5.1785 + dVar29 * 0.905775) +
                   1.0);
      dVar27 = dVar27 * (dVar29 * 0.0278125 + 1.0);
      dVar28 = dVar52 + dVar49;
      dVar18 = dVar28 * dVar28;
      pdVar6 = out->zk;
      if ((pdVar6 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        dVar38 = dVar52 * 0.2 + 1.0;
        dVar21 = dVar49 * 0.2 + 1.0;
        dVar39 = dVar38 * dVar38;
        dVar19 = dVar21 * dVar21;
        dVar17 = (dVar29 * 0.053425 + 1.0) * 0.062182 * dVar17;
        dVar20 = dVar49 * 0.003 + dVar52 * 0.003 + 1.0;
        dVar16 = dVar20 * dVar20;
        lVar8 = (long)(p->dim).zk * sVar10;
        pdVar6[lVar8] =
             dVar30 + dVar25 +
             (dVar37 * dVar37 * dVar14 * 0.0016 * dVar56 * (1.0 / (dVar39 * dVar39)) +
             dVar54 * dVar2 * dVar4 * 0.2 * (1.0 / dVar38) + dVar1 +
             dVar37 * dVar3 * 0.04 * dVar57 * (1.0 / dVar39) +
             dVar2 * dVar37 * dVar13 * 0.008 * dVar58 * (1.0 / (dVar38 * dVar39))) * local_120 +
             (dVar23 * dVar23 * dVar14 * 0.0016 * dVar51 * (1.0 / (dVar19 * dVar19)) +
             dVar50 * dVar4 * local_180 * 0.2 * (1.0 / dVar21) + dVar1 +
             dVar23 * dVar3 * 0.04 * dVar53 * (1.0 / dVar19) +
             local_180 * dVar23 * dVar13 * 0.008 * dVar55 * (1.0 / (dVar21 * dVar19))) * dVar15 +
             (dVar28 * pdVar5[0xb] * 0.003 * (1.0 / dVar20) + pdVar5[10] +
              pdVar5[0xc] * dVar18 * 9e-06 * (1.0 / dVar16) +
              dVar28 * dVar18 * pdVar5[0xd] * 2.7e-08 * (1.0 / (dVar20 * dVar16)) +
             dVar18 * dVar18 * pdVar5[0xe] * 8.1e-11 * (1.0 / (dVar16 * dVar16))) *
             (((dVar36 * 0.019751789702565206 * dVar27 +
               (dVar36 * (dVar27 * -0.019751789702565206 +
                         (dVar29 * 0.05137 + 1.0) * -0.03109 * dVar26 + dVar17) *
                (1.0 / (__x * __x * __x * __x)) * dVar35 * dVar35 * dVar35 * dVar35 - dVar17)) -
              local_120) - dVar15) + pdVar6[lVar8];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}